

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O1

int CVodeGetStgrSensNonlinSolvStats(void *cvode_mem,long *nSTGR1niters,long *nSTGR1nfails)

{
  uint uVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  ulong uVar4;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x99a;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      if (*(int *)((long)cvode_mem + 0x94) != 3) {
        return 0;
      }
      uVar1 = *(uint *)((long)cvode_mem + 0x90);
      if (0 < (int)uVar1) {
        lVar2 = *(long *)((long)cvode_mem + 0x688);
        uVar4 = 0;
        do {
          nSTGR1niters[uVar4] = *(long *)(lVar2 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      if ((int)uVar1 < 1) {
        return 0;
      }
      lVar2 = *(long *)((long)cvode_mem + 0x6a0);
      uVar4 = 0;
      do {
        nSTGR1nfails[uVar4] = *(long *)(lVar2 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar3 = -0x28;
    error_code = -0x28;
    line = 0x9a4;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetStgrSensNonlinSolvStats",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVodeGetStgrSensNonlinSolvStats(void* cvode_mem, long int* nSTGR1niters,
                                    long int* nSTGR1nfails)
{
  CVodeMem cv_mem;
  int is, Ns;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  Ns = cv_mem->cv_Ns;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  if (cv_mem->cv_ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++) { nSTGR1niters[is] = cv_mem->cv_nniS1[is]; }
    for (is = 0; is < Ns; is++) { nSTGR1nfails[is] = cv_mem->cv_nnfS1[is]; }
  }

  return (CV_SUCCESS);
}